

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void __thiscall boost::deflate::deflate_stream_test::run(deflate_stream_test *this)

{
  ostream *this_00;
  void *this_01;
  deflate_stream_test *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cerr,"sizeof(deflate_stream) == ");
  this_01 = (void *)std::ostream::operator<<(this_00,0x1740);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  testDeflate(this,(ICompressor *)this);
  testDeflate(this,&(this->beast_compressor).super_ICompressor);
  testInvalidSettings((ICompressor *)this);
  testInvalidSettings(&(this->beast_compressor).super_ICompressor);
  testWriteAfterFinish((ICompressor *)this);
  testWriteAfterFinish(&(this->beast_compressor).super_ICompressor);
  testFlushPartial((ICompressor *)this);
  testFlushPartial(&(this->beast_compressor).super_ICompressor);
  testFlushAtLiteralBufferFull((ICompressor *)this);
  testFlushAtLiteralBufferFull(&(this->beast_compressor).super_ICompressor);
  testRLEMatchLengthExceedLookahead((ICompressor *)this);
  testRLEMatchLengthExceedLookahead(&(this->beast_compressor).super_ICompressor);
  testFlushAfterDistMatch((ICompressor *)this);
  testFlushAfterDistMatch(&(this->beast_compressor).super_ICompressor);
  testWrappedStream();
  return;
}

Assistant:

void
    run()
    {
        std::cerr <<
            "sizeof(deflate_stream) == " <<
            sizeof(deflate_stream) << std::endl;

        testDeflate(zlib_compressor);
        testDeflate(beast_compressor);
        testInvalidSettings(zlib_compressor);
        testInvalidSettings(beast_compressor);
        testWriteAfterFinish(zlib_compressor);
        testWriteAfterFinish(beast_compressor);
        testFlushPartial(zlib_compressor);
        testFlushPartial(beast_compressor);
        testFlushAtLiteralBufferFull(zlib_compressor);
        testFlushAtLiteralBufferFull(beast_compressor);
        testRLEMatchLengthExceedLookahead(zlib_compressor);
        testRLEMatchLengthExceedLookahead(beast_compressor);
        testFlushAfterDistMatch(zlib_compressor);
        testFlushAfterDistMatch(beast_compressor);
        testWrappedStream();
    }